

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

string * cmsys::SystemTools::GetFilenameExtension(string *__return_storage_ptr__,string *filename)

{
  long lVar1;
  allocator local_31;
  string name;
  
  GetFilenameName(&name,filename);
  lVar1 = std::__cxx11::string::find((char)&name,0x2e);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_31);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&name);
  }
  std::__cxx11::string::~string((string *)&name);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::GetFilenameExtension(const std::string& filename)
{
  std::string name = SystemTools::GetFilenameName(filename);
  std::string::size_type dot_pos = name.find('.');
  if (dot_pos != std::string::npos) {
    return name.substr(dot_pos);
  } else {
    return "";
  }
}